

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O1

void png_formatted_warning(png_const_structrp png_ptr,char (*p) [32],png_const_charp message)

{
  ulong uVar1;
  long lVar2;
  char cVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  char (*pacVar7) [32];
  char msg [192];
  char local_d8 [192];
  
  uVar4 = 0;
  do {
    if (*message == '\0') break;
    pcVar5 = message;
    if (((p == (char (*) [32])0x0) || (*message != '@')) || (message[1] == '\0')) {
LAB_002c3d8c:
      cVar3 = *pcVar5;
      pcVar5 = pcVar5 + 1;
      local_d8[uVar4] = cVar3;
      uVar4 = uVar4 + 1;
    }
    else {
      pcVar5 = message + 1;
      pacVar7 = p + -1;
      uVar6 = 0xffffffffffffffff;
      do {
        uVar1 = uVar6 + 1;
        pacVar7 = pacVar7 + 1;
        if (uVar6 == 8) break;
        lVar2 = uVar6 + 1;
        uVar6 = uVar1;
      } while ("123456789"[lVar2] != message[1]);
      if (uVar1 < 8) {
        if (uVar4 < 0xbf) {
          uVar6 = 0;
          do {
            if (((*pacVar7)[uVar6] == '\0') || (0x1f < uVar6)) {
              uVar4 = uVar4 + uVar6;
              goto LAB_002c3d82;
            }
            local_d8[uVar6 + uVar4] = (*pacVar7)[uVar6];
            lVar2 = uVar4 + uVar6;
            uVar6 = uVar6 + 1;
          } while (lVar2 != 0xbe);
          uVar4 = 0xbf;
        }
LAB_002c3d82:
        pcVar5 = message + 2;
      }
      if (7 < uVar1) goto LAB_002c3d8c;
    }
    message = pcVar5;
  } while (uVar4 < 0xbf);
  local_d8[uVar4] = '\0';
  png_warning(png_ptr,local_d8);
  return;
}

Assistant:

void
png_formatted_warning(png_const_structrp png_ptr, png_warning_parameters p,
    png_const_charp message)
{
   /* The internal buffer is just 192 bytes - enough for all our messages,
    * overflow doesn't happen because this code checks!  If someone figures
    * out how to send us a message longer than 192 bytes, all that will
    * happen is that the message will be truncated appropriately.
    */
   size_t i = 0; /* Index in the msg[] buffer: */
   char msg[192];

   /* Each iteration through the following loop writes at most one character
    * to msg[i++] then returns here to validate that there is still space for
    * the trailing '\0'.  It may (in the case of a parameter) read more than
    * one character from message[]; it must check for '\0' and continue to the
    * test if it finds the end of string.
    */
   while (i<(sizeof msg)-1 && *message != '\0')
   {
      /* '@' at end of string is now just printed (previously it was skipped);
       * it is an error in the calling code to terminate the string with @.
       */
      if (p != NULL && *message == '@' && message[1] != '\0')
      {
         int parameter_char = *++message; /* Consume the '@' */
         static const char valid_parameters[] = "123456789";
         int parameter = 0;

         /* Search for the parameter digit, the index in the string is the
          * parameter to use.
          */
         while (valid_parameters[parameter] != parameter_char &&
            valid_parameters[parameter] != '\0')
            ++parameter;

         /* If the parameter digit is out of range it will just get printed. */
         if (parameter < PNG_WARNING_PARAMETER_COUNT)
         {
            /* Append this parameter */
            png_const_charp parm = p[parameter];
            png_const_charp pend = p[parameter] + (sizeof p[parameter]);

            /* No need to copy the trailing '\0' here, but there is no guarantee
             * that parm[] has been initialized, so there is no guarantee of a
             * trailing '\0':
             */
            while (i<(sizeof msg)-1 && *parm != '\0' && parm < pend)
               msg[i++] = *parm++;

            /* Consume the parameter digit too: */
            ++message;
            continue;
         }

         /* else not a parameter and there is a character after the @ sign; just
          * copy that.  This is known not to be '\0' because of the test above.
          */
      }

      /* At this point *message can't be '\0', even in the bad parameter case
       * above where there is a lone '@' at the end of the message string.
       */
      msg[i++] = *message++;
   }

   /* i is always less than (sizeof msg), so: */
   msg[i] = '\0';

   /* And this is the formatted message. It may be larger than
    * PNG_MAX_ERROR_TEXT, but that is only used for 'chunk' errors and these
    * are not (currently) formatted.
    */
   png_warning(png_ptr, msg);
}